

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffComplex<KVEntryUint32> *diff)

{
  bool bVar1;
  char *index;
  DiffComplex<KVEntryUint32> *this_00;
  DiffComplex<KVEntryUint32> *in_RSI;
  char *in_RDI;
  DiffComplex<KVEntryUint32> *unaff_retaddr;
  char *nl;
  char *space;
  undefined4 in_stack_00000028;
  int in_stack_0000002c;
  PrintIndent *in_stack_00000030;
  undefined4 in_stack_00000038;
  int in_stack_0000003c;
  PrintIndent *in_stack_00000040;
  int in_stack_0000004c;
  PrintIndent *in_stack_00000050;
  int indent;
  char *index_00;
  
  index_00 = in_RDI;
  bVar1 = DiffComplex<KVEntryUint32>::isDifferent(in_RSI);
  if (bVar1) {
    in_RDI[0x58] = '\x01';
    index = "";
    if (*(int *)(in_RDI + 8) != 2) {
      index = " ";
    }
    this_00 = (DiffComplex<KVEntryUint32> *)0x3a2318;
    if (*(int *)(in_RDI + 8) != 2) {
      this_00 = (DiffComplex<KVEntryUint32> *)0x387003;
    }
    if (*(int *)(in_RDI + 8) == 0) {
      printContext((PrintDiff *)unaff_retaddr);
      bVar1 = DiffComplex<KVEntryUint32>::hasValue(this_00,(size_t)in_RDI);
      if (bVar1) {
        PrintIndent::operator()
                  (in_stack_00000040,in_stack_0000003c,(char (*) [5])in_stack_00000030,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_0000002c,in_stack_00000028));
        DiffComplex<KVEntryUint32>::printText(in_RSI,(size_t)index,(PrintIndent *)this_00,in_RDI);
      }
      bVar1 = DiffComplex<KVEntryUint32>::hasValue(this_00,(size_t)in_RDI);
      if (bVar1) {
        PrintIndent::operator()
                  (in_stack_00000040,in_stack_0000003c,(char (*) [5])in_stack_00000030,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_0000002c,in_stack_00000028));
        DiffComplex<KVEntryUint32>::printText(in_RSI,(size_t)index,(PrintIndent *)this_00,in_RDI);
      }
    }
    else {
      beginJsonOutput((PrintDiff *)unaff_retaddr);
      indent = (int)((ulong)index >> 0x20);
      PrintIndent::operator()
                (in_stack_00000050,in_stack_0000004c,(char (*) [11])in_stack_00000040,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_0000003c,in_stack_00000038),(char **)in_stack_00000030,
                 (char **)CONCAT44(in_stack_0000002c,in_stack_00000028));
      bVar1 = DiffComplex<KVEntryUint32>::hasValue(this_00,(size_t)in_RDI);
      if (bVar1) {
        DiffComplex<KVEntryUint32>::printJson
                  (unaff_retaddr,(size_t)index_00,(PrintIndent *)in_RSI,indent,(char *)this_00,
                   in_RDI);
        PrintIndent::operator()
                  (in_stack_00000040,in_stack_0000003c,(char (*) [4])in_stack_00000030,
                   (char **)CONCAT44(in_stack_0000002c,in_stack_00000028));
      }
      else {
        PrintIndent::operator()
                  (in_stack_00000040,in_stack_0000003c,(char (*) [8])in_stack_00000030,
                   (char **)CONCAT44(in_stack_0000002c,in_stack_00000028));
      }
      bVar1 = DiffComplex<KVEntryUint32>::hasValue(this_00,(size_t)in_RDI);
      if (bVar1) {
        DiffComplex<KVEntryUint32>::printJson
                  (unaff_retaddr,(size_t)index_00,(PrintIndent *)in_RSI,indent,(char *)this_00,
                   in_RDI);
        PrintIndent::operator()
                  (in_stack_00000040,in_stack_0000003c,(char (*) [3])in_stack_00000030,
                   (char **)CONCAT44(in_stack_0000002c,in_stack_00000028));
      }
      else {
        PrintIndent::operator()
                  (in_stack_00000040,in_stack_0000003c,(char (*) [7])in_stack_00000030,
                   (char **)CONCAT44(in_stack_0000002c,in_stack_00000028));
      }
      PrintIndent::operator()(in_stack_00000030,in_stack_0000002c,(char (*) [2])this);
    }
  }
  return;
}

Assistant:

void operator<<(const DiffComplex<T>& diff) {
        if (!diff.isDifferent()) return;
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        if (outputFormat == OutputFormat::text) {
            printContext();
            if (diff.hasValue(0)) {
                printIndent(0, "-{}:", diff.textHeader);
                diff.printText(0, printIndent, "-");
            }
            if (diff.hasValue(1)) {
                printIndent(0, "+{}:", diff.textHeader);
                diff.printText(1, printIndent, "+");
            }
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[{}", diff.jsonPath, space, nl);
            if (diff.hasValue(0)) {
                diff.printJson(0, printIndent, 3, space, nl);
                printIndent(0, ",{}", nl);
            } else
                printIndent(3, "null,{}", nl);
            if (diff.hasValue(1)) {
                diff.printJson(1, printIndent, 3, space, nl);
                printIndent(0, "{}", nl);
            } else
                printIndent(3, "null{}", nl);
            printIndent(2, "]");
        }
    }